

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayStencilAttachments.cpp
# Opt level: O0

void __thiscall
glcts::TextureCubeMapArrayStencilAttachments::initTest(TextureCubeMapArrayStencilAttachments *this)

{
  int iVar1;
  deUint32 dVar2;
  NotSupportedError *pNVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  undefined8 *puVar6;
  CubeMapArrayDataStorage *local_c0;
  undefined1 local_98 [8];
  GLfloat vertices [16];
  Functions *gl;
  string local_40;
  TextureCubeMapArrayStencilAttachments *local_10;
  TextureCubeMapArrayStencilAttachments *this_local;
  long lVar5;
  
  local_10 = this;
  if (((this->super_TestCaseBase).m_is_texture_cube_map_array_supported & 1U) == 0) {
    pNVar3 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar3,"Texture cube map array functionality not supported, skipping","",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayStencilAttachments.cpp"
               ,0x2c3);
    __cxa_throw(pNVar3,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError)
    ;
  }
  if ((((this->super_TestCaseBase).m_is_geometry_shader_extension_supported & 1U) == 0) &&
     (this->m_fbo_layered != '\0')) {
    gl._6_1_ = 1;
    pNVar3 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"Geometry shader functionality not supported, skipping",
               (allocator<char> *)((long)&gl + 7));
    tcu::NotSupportedError::NotSupportedError(pNVar3,&local_40);
    gl._6_1_ = 0;
    __cxa_throw(pNVar3,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError)
    ;
  }
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar1 = (*pRVar4->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar1);
  puVar6 = (undefined8 *)operator_new__(0x68);
  *puVar6 = 4;
  local_c0 = (CubeMapArrayDataStorage *)(puVar6 + 1);
  do {
    CubeMapArrayDataStorage::CubeMapArrayDataStorage(local_c0);
    local_c0 = local_c0 + 1;
  } while (local_c0 != (CubeMapArrayDataStorage *)(puVar6 + 0xd));
  this->m_cube_map_array_data = (CubeMapArrayDataStorage *)(puVar6 + 1);
  CubeMapArrayDataStorage::init(this->m_cube_map_array_data,(EVP_PKEY_CTX *)0x40);
  CubeMapArrayDataStorage::init(this->m_cube_map_array_data + 1,(EVP_PKEY_CTX *)0x75);
  CubeMapArrayDataStorage::init(this->m_cube_map_array_data + 2,(EVP_PKEY_CTX *)0x100);
  CubeMapArrayDataStorage::init(this->m_cube_map_array_data + 3,(EVP_PKEY_CTX *)0xad);
  memcpy(local_98,&DAT_02b26b20,0x40);
  (**(code **)(lVar5 + 0x708))(1,&this->m_vao_id);
  (**(code **)(lVar5 + 0xd8))(this->m_vao_id);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"Could not create vertex array object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayStencilAttachments.cpp"
                  ,0x2dd);
  (**(code **)(lVar5 + 0x6c8))(1,&this->m_vbo_id);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"Could not generate buffer object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayStencilAttachments.cpp"
                  ,0x2e0);
  (**(code **)(lVar5 + 0x40))(0x8892,this->m_vbo_id);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"Could not bind buffer object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayStencilAttachments.cpp"
                  ,0x2e3);
  (**(code **)(lVar5 + 0x150))(0x8892,0x40,local_98,0x88e4);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"Could not set data for buffer object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayStencilAttachments.cpp"
                  ,0x2e6);
  (**(code **)(lVar5 + 0x6d0))(1,&this->m_fbo_read_id);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"Could not generate framebuffer object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayStencilAttachments.cpp"
                  ,0x2ea);
  (**(code **)(lVar5 + 0x6d0))(1,&this->m_fbo_draw_id);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"Could not generate framebuffer object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayStencilAttachments.cpp"
                  ,0x2ed);
  (**(code **)(lVar5 + 0x5e0))(0xb90);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"Could not enable stencil test!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayStencilAttachments.cpp"
                  ,0x2f0);
  return;
}

Assistant:

void TextureCubeMapArrayStencilAttachments::initTest(void)
{
	/* Check if EXT_texture_cube_map_array extension is supported */
	if (!m_is_texture_cube_map_array_supported)
	{
		throw tcu::NotSupportedError(TEXTURE_CUBE_MAP_ARRAY_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}
	if (!m_is_geometry_shader_extension_supported && m_fbo_layered)
	{
		throw tcu::NotSupportedError(GEOMETRY_SHADER_EXTENSION_NOT_SUPPORTED);
	}

	/* Retrieve ES entry-points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Create 4 different configurations of cube map array texture */
	m_cube_map_array_data = new CubeMapArrayDataStorage[m_n_cube_map_array_configurations];

	m_cube_map_array_data[0].init(64, 64, 18);
	m_cube_map_array_data[1].init(117, 117, 6);
	m_cube_map_array_data[2].init(256, 256, 6);
	m_cube_map_array_data[3].init(173, 173, 12);

	/* full screen square */
	glw::GLfloat vertices[] = { -1.0f, -1.0f, 0.0f, 1.0f, -1.0f, 1.0f, 0.0f, 1.0f,
								1.0f,  -1.0f, 0.0f, 1.0f, 1.0f,  1.0f, 0.0f, 1.0f };

	/* Generate and bind VAO */
	gl.genVertexArrays(1, &m_vao_id);
	gl.bindVertexArray(m_vao_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create vertex array object");

	gl.genBuffers(1, &m_vbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not generate buffer object!");

	gl.bindBuffer(GL_ARRAY_BUFFER, m_vbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not bind buffer object!");

	gl.bufferData(GL_ARRAY_BUFFER, sizeof(vertices), vertices, GL_STATIC_DRAW);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set data for buffer object!");

	/* Create and configure framebuffer object */
	gl.genFramebuffers(1, &m_fbo_read_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not generate framebuffer object!");

	gl.genFramebuffers(1, &m_fbo_draw_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not generate framebuffer object!");

	gl.enable(GL_STENCIL_TEST);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not enable stencil test!");
}